

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  ostream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  __pid_t _Var4;
  size_t sVar5;
  stringstream *this_00;
  int *piVar6;
  long *plVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong *puVar10;
  undefined8 *puVar11;
  size_type *psVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  undefined8 uVar16;
  int pipe_fd [2];
  ulong *local_130;
  long local_128;
  ulong local_120;
  undefined8 uStack_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  string local_d0;
  int local_b0;
  int local_ac;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  int local_84;
  string local_80;
  string local_60;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  sVar5 = GetThreadCount();
  if (sVar5 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_a8,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                       ,0x462);
    this_00 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_00);
    poVar1 = (ostream *)(this_00 + 0x10);
    *(undefined8 *)(this_00 + *(long *)(*(long *)(this_00 + 0x10) + -0x18) + 0x18) = 0x11;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," in a threaded context. For this test, ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (sVar5 == 0) {
      pcVar14 = "couldn\'t detect the number of threads.";
      lVar13 = 0x26;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar14 = " threads.";
      lVar13 = 9;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar14,lVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               " See https://github.com/google/googletest/blob/master/googletest/docs/advanced.md#death-tests-and-threads"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," for more explanation and suggested solutions, especially if",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," this is the last message you see before your test times out.",0x3d);
    StringStreamToString(&local_d0,(stringstream *)this_00);
    (**(code **)(*(long *)this_00 + 8))(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_a8);
  }
  iVar3 = pipe(&local_b0);
  if (iVar3 == -1) {
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CHECK failed: File ","");
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_40);
    local_f0 = (ulong *)*puVar8;
    puVar10 = puVar8 + 2;
    if (local_f0 == puVar10) {
      local_e0 = *puVar10;
      lStack_d8 = puVar8[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar10;
    }
    local_e8 = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
    local_130 = (ulong *)*puVar8;
    puVar10 = puVar8 + 2;
    if (local_130 == puVar10) {
      local_120 = *puVar10;
      uStack_118 = puVar8[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *puVar10;
    }
    local_128 = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    local_60._M_dataplus._M_p._0_4_ = 0x466;
    StreamableToString<int>(&local_80,(int *)&local_60);
    uVar15 = 0xf;
    if (local_130 != &local_120) {
      uVar15 = local_120;
    }
    if (uVar15 < local_80._M_string_length + local_128) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        uVar16 = local_80.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_80._M_string_length + local_128) goto LAB_001743a0;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_130);
    }
    else {
LAB_001743a0:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_80._M_dataplus._M_p);
    }
    local_110 = (undefined8 *)*puVar8;
    puVar11 = puVar8 + 2;
    if (local_110 == puVar11) {
      local_100 = *puVar11;
      uStack_f8 = puVar8[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *puVar11;
    }
    local_108 = puVar8[1];
    *puVar8 = puVar11;
    puVar8[1] = 0;
    *(undefined1 *)puVar11 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
    local_a8 = (long *)*puVar8;
    plVar7 = puVar8 + 2;
    if (local_a8 == plVar7) {
      local_98 = *plVar7;
      lStack_90 = puVar8[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar7;
    }
    local_a0 = puVar8[1];
    *puVar8 = plVar7;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_d0._M_dataplus._M_p = (pointer)*plVar7;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar12) {
      local_d0.field_2._M_allocated_capacity = *psVar12;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      goto LAB_001741e3;
    }
  }
  else {
    paVar2 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var4 = fork();
    if (_Var4 == -1) {
      local_40 = &local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CHECK failed: File ","");
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_40);
      local_f0 = (ulong *)*puVar8;
      puVar10 = puVar8 + 2;
      if (local_f0 == puVar10) {
        local_e0 = *puVar10;
        lStack_d8 = puVar8[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *puVar10;
      }
      local_e8 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
      local_130 = (ulong *)*puVar8;
      puVar10 = puVar8 + 2;
      if (local_130 == puVar10) {
        local_120 = *puVar10;
        uStack_118 = puVar8[3];
        local_130 = &local_120;
      }
      else {
        local_120 = *puVar10;
      }
      local_128 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      local_60._M_dataplus._M_p._0_4_ = 0x474;
      StreamableToString<int>(&local_80,(int *)&local_60);
      uVar15 = 0xf;
      if (local_130 != &local_120) {
        uVar15 = local_120;
      }
      if (uVar15 < local_80._M_string_length + local_128) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          uVar16 = local_80.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_80._M_string_length + local_128) goto LAB_0017449a;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_130);
      }
      else {
LAB_0017449a:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_130,(ulong)local_80._M_dataplus._M_p);
      }
      local_110 = (undefined8 *)*puVar8;
      puVar11 = puVar8 + 2;
      if (local_110 == puVar11) {
        local_100 = *puVar11;
        uStack_f8 = puVar8[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *puVar11;
      }
      local_108 = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)puVar11 = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
      local_a8 = (long *)*puVar8;
      plVar7 = puVar8 + 2;
      if (local_a8 == plVar7) {
        local_98 = *plVar7;
        lStack_90 = puVar8[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar7;
      }
      local_a0 = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
    }
    else {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var4;
      if (_Var4 == 0) {
        do {
          iVar3 = close(local_b0);
          if (iVar3 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_ac;
            UnitTest::GetInstance();
            (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
                 false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar6 = __errno_location();
        } while (*piVar6 == 4);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"CHECK failed: File ","");
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        local_40 = (long *)*puVar8;
        plVar7 = puVar8 + 2;
        if (local_40 == plVar7) {
          local_30 = *plVar7;
          lStack_28 = puVar8[3];
          local_40 = &local_30;
        }
        else {
          local_30 = *plVar7;
        }
        local_38 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_40);
        local_f0 = (ulong *)*puVar8;
        puVar10 = puVar8 + 2;
        if (local_f0 == puVar10) {
          local_e0 = *puVar10;
          lStack_d8 = puVar8[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *puVar10;
        }
        local_e8 = puVar8[1];
        *puVar8 = puVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        local_84 = 0x477;
        StreamableToString<int>(&local_60,&local_84);
        uVar15 = 0xf;
        if (local_f0 != &local_e0) {
          uVar15 = local_e0;
        }
        if (uVar15 < local_60._M_string_length + local_e8) {
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_) !=
              &local_60.field_2) {
            uVar16 = local_60.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < local_60._M_string_length + local_e8) goto LAB_00173fc5;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_f0);
        }
        else {
LAB_00173fc5:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_f0,
                              CONCAT44(local_60._M_dataplus._M_p._4_4_,
                                       local_60._M_dataplus._M_p._0_4_));
        }
        local_130 = (ulong *)*puVar8;
        puVar10 = puVar8 + 2;
        if (local_130 == puVar10) {
          local_120 = *puVar10;
          uStack_118 = puVar8[3];
          local_130 = &local_120;
        }
        else {
          local_120 = *puVar10;
        }
        local_128 = puVar8[1];
        *puVar8 = puVar10;
        puVar8[1] = 0;
        *(undefined1 *)puVar10 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
        local_110 = (undefined8 *)*puVar8;
        puVar11 = puVar8 + 2;
        if (local_110 == puVar11) {
          local_100 = *puVar11;
          uStack_f8 = puVar8[3];
          local_110 = &local_100;
        }
        else {
          local_100 = *puVar11;
        }
        local_108 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
      }
      else {
        do {
          iVar3 = close(local_ac);
          if (iVar3 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_b0;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar6 = __errno_location();
        } while (*piVar6 == 4);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"CHECK failed: File ","");
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_40 = (long *)*plVar7;
        plVar9 = plVar7 + 2;
        if (local_40 == plVar9) {
          local_30 = *plVar9;
          lStack_28 = plVar7[3];
          local_40 = &local_30;
        }
        else {
          local_30 = *plVar9;
        }
        local_38 = plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_40);
        local_f0 = (ulong *)*plVar7;
        puVar10 = (ulong *)(plVar7 + 2);
        if (local_f0 == puVar10) {
          local_e0 = *puVar10;
          lStack_d8 = plVar7[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *puVar10;
        }
        local_e8 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        local_84 = 0x483;
        StreamableToString<int>(&local_60,&local_84);
        uVar15 = 0xf;
        if (local_f0 != &local_e0) {
          uVar15 = local_e0;
        }
        if (uVar15 < local_60._M_string_length + local_e8) {
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_) !=
              &local_60.field_2) {
            uVar16 = local_60.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < local_60._M_string_length + local_e8) goto LAB_00173ec2;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_f0);
        }
        else {
LAB_00173ec2:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_f0,
                              CONCAT44(local_60._M_dataplus._M_p._4_4_,
                                       local_60._M_dataplus._M_p._0_4_));
        }
        local_130 = (ulong *)*puVar8;
        puVar10 = puVar8 + 2;
        if (local_130 == puVar10) {
          local_120 = *puVar10;
          uStack_118 = puVar8[3];
          local_130 = &local_120;
        }
        else {
          local_120 = *puVar10;
        }
        local_128 = puVar8[1];
        *puVar8 = puVar10;
        puVar8[1] = 0;
        *(undefined1 *)puVar10 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
        local_110 = (undefined8 *)*puVar8;
        puVar11 = puVar8 + 2;
        if (local_110 == puVar11) {
          local_100 = *puVar11;
          uStack_f8 = puVar8[3];
          local_110 = &local_100;
        }
        else {
          local_100 = *puVar11;
        }
        local_108 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
      }
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_a8 = (long *)*plVar7;
      plVar9 = plVar7 + 2;
      if (local_a8 == plVar9) {
        local_98 = *plVar9;
        lStack_90 = plVar7[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar9;
      }
      local_a0 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
    }
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_d0._M_dataplus._M_p = (pointer)*plVar7;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar12) {
      local_d0.field_2._M_allocated_capacity = *psVar12;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)paVar2;
      goto LAB_001741e3;
    }
  }
  local_d0.field_2._M_allocated_capacity = *psVar12;
LAB_001741e3:
  local_d0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  DeathTestAbort(&local_d0);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}